

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

int64_t __thiscall wasm::Random::get64(Random *this)

{
  ushort uVar1;
  int16_t iVar2;
  ushort uVar3;
  int16_t iVar4;
  
  uVar1 = get16(this);
  iVar2 = get16(this);
  uVar3 = get16(this);
  iVar4 = get16(this);
  return (long)(int)((int)iVar4 | (uint)uVar3 << 0x10) |
         (ulong)((int)iVar2 | (uint)uVar1 << 0x10) << 0x20;
}

Assistant:

int64_t Random::get64() {
  auto temp = uint64_t(get32()) << 32;
  return temp | uint64_t(get32());
}